

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWSLoader.cpp
# Opt level: O1

void __thiscall Assimp::LWSImporter::LWSImporter(LWSImporter *this)

{
  BaseImporter::BaseImporter(&this->super_BaseImporter);
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_008edce0;
  this->configSpeedFlag = false;
  this->io = (IOSystem *)0x0;
  this->first = 0.0;
  this->last = 0.0;
  this->fps = 0.0;
  this->noSkeletonMesh = false;
  return;
}

Assistant:

LWSImporter::LWSImporter()
    : configSpeedFlag(),
    io(),
    first(),
    last(),
    fps(),
    noSkeletonMesh()
{
    // nothing to do here
}